

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::funcAllowed
          (SparseTexture2LookupTestCase *this,GLint target,GLint format,FunctionToken *funcToken)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  p_Var1 = &(funcToken->allowedTargets)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (funcToken->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < target]) {
    if (target <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, target < (int)p_Var4[1]._M_color))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) goto LAB_00a6f34e;
  if (format == 0x81a5) {
    iVar3 = std::__cxx11::string::compare((char *)funcToken);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)funcToken), iVar3 == 0)) {
      if (target == 0xde1) goto LAB_00a6f342;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)funcToken);
      if ((((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)funcToken), iVar3 == 0))
          || (iVar3 = std::__cxx11::string::compare((char *)funcToken), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((char *)funcToken), iVar3 == 0)) {
        if (((target == 0xde1) || (target == 0x84f5)) || (target == 0x8c1a)) goto LAB_00a6f342;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)funcToken);
        if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)funcToken), iVar3 != 0))
        {
          iVar3 = std::__cxx11::string::compare((char *)funcToken);
          if (iVar3 == 0) {
            if (target != 0x9009) goto LAB_00a6f342;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)funcToken);
            if (iVar3 != 0) goto LAB_00a6f342;
          }
        }
      }
    }
LAB_00a6f34e:
    bVar2 = false;
  }
  else {
LAB_00a6f342:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SparseTexture2LookupTestCase::funcAllowed(GLint target, GLint format, FunctionToken& funcToken)
{
	if (funcToken.allowedTargets.find(target) == funcToken.allowedTargets.end())
		return false;

	if (format == GL_DEPTH_COMPONENT16)
	{
		if (funcToken.name == "sparseTextureLodARB" || funcToken.name == "sparseTextureLodOffsetARB")
		{
			if (target != GL_TEXTURE_2D)
				return false;
		}
		else if (funcToken.name == "sparseTextureOffsetARB" || funcToken.name == "sparseTextureGradOffsetARB" ||
				 funcToken.name == "sparseTextureGatherOffsetARB" || funcToken.name == "sparseTextureGatherOffsetsARB")
		{
			if (target != GL_TEXTURE_2D && target != GL_TEXTURE_2D_ARRAY && target != GL_TEXTURE_RECTANGLE)
			{
				return false;
			}
		}
		else if (funcToken.name == "sparseTexelFetchARB" || funcToken.name == "sparseTexelFetchOffsetARB")
		{
			return false;
		}
		else if (funcToken.name == "sparseTextureGradARB")
		{
			if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
				return false;
		}
		else if (funcToken.name == "sparseImageLoadARB")
		{
			return false;
		}
	}

	return true;
}